

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O3

TPZString * __thiscall
TPZString::SubStr(TPZString *__return_storage_ptr__,TPZString *this,int start,int end)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  
  if ((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fNElements ==
      0) {
    uVar1 = 0;
  }
  else {
    uVar1 = strlen((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
                   fStore);
  }
  if (end < start || uVar1 < (ulong)(long)start) {
    TPZString(__return_storage_ptr__);
  }
  else {
    uVar3 = 0;
    if (0 < start) {
      uVar3 = start;
    }
    iVar4 = (int)uVar1 + -1;
    if ((ulong)(long)end <= uVar1) {
      iVar4 = end;
    }
    TPZString(__return_storage_ptr__,(iVar4 - uVar3) + 2);
    if ((int)uVar3 <= iVar4) {
      lVar2 = 0;
      do {
        (__return_storage_ptr__->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.
        super_TPZVec<char>.fStore[lVar2] =
             (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore
             [lVar2 + (ulong)uVar3];
        lVar2 = lVar2 + 1;
      } while (((ulong)uVar3 - (ulong)(iVar4 + 1)) + lVar2 != 0);
    }
    (__return_storage_ptr__->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.
    super_TPZVec<char>.fStore
    [(__return_storage_ptr__->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.
     super_TPZVec<char>.fNElements + -1] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

TPZString TPZString::SubStr(const int start, const int end) const
{
	size_t len = Length();
	if (start > len || start > end)
	{
		TPZString newstring;
		return newstring;
	}
	
	int startpos = start, endpos = end, i;
	
	if (startpos < 0) startpos = 0;
	
	if (endpos > len) endpos = len - 1; // null ending character index
	
	TPZString newstring(endpos - startpos + 2);
	for (i = startpos; i <= endpos; i++) newstring[i - startpos] = fStore[i];
	
	newstring[newstring.NElements() - 1] = '\0';
	return newstring;
}